

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Number luaL_checknumber(lua_State *L,int idx)

{
  int iVar1;
  TValue local_38;
  TValue tmp;
  cTValue *o;
  lua_State *plStack_20;
  int idx_local;
  lua_State *L_local;
  
  o._4_4_ = idx;
  plStack_20 = L;
  tmp = (TValue)index2adr(L,idx);
  if ((uint)((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf) < 0xfffffff3) {
    return (lua_Number)*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp;
  }
  if (((int)(*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)tmp).it >> 0xf == -5) &&
     (iVar1 = lj_strscan_num((GCstr *)(*(ulong *)tmp & 0x7fffffffffff),&local_38), iVar1 != 0)) {
    return (lua_Number)local_38.u64;
  }
  lj_err_argt(plStack_20,o._4_4_,3);
}

Assistant:

LUALIB_API lua_Number luaL_checknumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (!(tvisstr(o) && lj_strscan_num(strV(o), &tmp)))
    lj_err_argt(L, idx, LUA_TNUMBER);
  return numV(&tmp);
}